

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O2

void __thiscall wasm::OnceReduction::run(OnceReduction *this,Module *module)

{
  __node_base_ptr *__ht;
  pointer puVar1;
  Global *__k;
  pointer puVar2;
  pointer puVar3;
  Export *pEVar4;
  uint uVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  size_type *psVar8;
  bool bVar9;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar10;
  pointer puVar11;
  pointer puVar12;
  uint uVar13;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  size_type *psVar14;
  __int_type_conflict _Var15;
  undefined1 auStack_3f8 [8];
  mapped_type global_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  Expression **local_3c8;
  size_t sStack_3c0;
  pointer local_318;
  pointer pTStack_310;
  pointer local_308;
  Function *pFStack_300;
  Module *local_2f8;
  Expression **ppEStack_2f0;
  Expression *local_2e8;
  __node_base local_2e0;
  Expression *pEStack_2d8;
  float local_2d0;
  Expression *local_2c8;
  Expression *pEStack_2c0;
  OptInfo *local_2b8;
  pointer local_298;
  pointer ppEStack_290;
  pointer local_288;
  pointer local_270;
  pointer puStack_268;
  pointer local_260;
  pointer ppBStack_258;
  pointer local_250;
  pointer ppBStack_248;
  _Rb_tree_node_base local_230;
  undefined1 local_210 [184];
  _Rb_tree_node_base local_158;
  size_t local_138;
  undefined1 *local_130;
  undefined1 local_120 [8];
  OptInfo optInfo;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  
  local_120 = (undefined1  [8])&optInfo.onceGlobals._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceGlobals._M_h._M_buckets = (__buckets_ptr)0x1;
  optInfo.onceGlobals._M_h._M_bucket_count = 0;
  optInfo.onceGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceGlobals._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceGlobals._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceGlobals._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceGlobals._M_h._M_rehash_policy._M_next_resize = 0;
  optInfo.onceGlobals._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.onceFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  psVar14 = &optInfo.onceFuncs._M_h._M_bucket_count;
  optInfo.onceFuncs._M_h._M_bucket_count = 0;
  optInfo.onceFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  optInfo.onceFuncs._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceGlobalsSetInFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  optInfo.onceGlobalsSetInFuncs._M_h._M_bucket_count = 0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  __ht = &optInfo.onceGlobalsSetInFuncs._M_h._M_single_bucket;
  optInfo.onceGlobalsSetInFuncs._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_bucket_count = 0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_single_bucket = (__node_base_ptr)this;
  for (puVar10 = (module->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar1; puVar10 = puVar10 + 1
      ) {
    __k = (puVar10->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (((__k->type).id & 0xfffffffffffffffe) == 2) {
      _Var15 = (__k->super_Importable).module.super_IString.str._M_str == (char *)0x0;
    }
    else {
      _Var15 = false;
    }
    pmVar6 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_120,(key_type *)__k);
    LOCK();
    (pmVar6->_M_base)._M_i = _Var15;
    UNLOCK();
  }
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar12 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar2; puVar12 = puVar12 + 1
      ) {
    pmVar7 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&optInfo.onceGlobals._M_h._M_single_bucket,
                          (key_type *)
                          (puVar12->_M_t).
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    (pmVar7->super_IString).str._M_len = 0;
    (pmVar7->super_IString).str._M_str = (char *)0x0;
  }
  puVar3 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar11 = (module->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar3; puVar11 = puVar11 + 1
      ) {
    pEVar4 = (puVar11->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (pEVar4->kind == Global) {
      pmVar6 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_120,&pEVar4->value);
      LOCK();
      (pmVar6->_M_base)._M_i = false;
      UNLOCK();
    }
  }
  global_1.super_IString.str._M_str = (char *)&local_3d8;
  global_1.super_IString.str._M_len = 0;
  local_3d8._M_local_buf[0] = '\0';
  local_3c8 = (Expression **)0x0;
  sStack_3c0 = 0;
  local_2f8 = (Module *)0x0;
  local_318 = (pointer)0x0;
  pTStack_310 = (pointer)0x0;
  local_308 = (pointer)0x0;
  pFStack_300 = (Function *)0x0;
  auStack_3f8 = (undefined1  [8])&PTR__Scanner_00e1faf0;
  ppEStack_2f0 = &pEStack_2c0;
  local_2e8 = (Expression *)0x1;
  local_2e0._M_nxt = (_Hash_node_base *)0x0;
  pEStack_2d8 = (Expression *)0x0;
  local_2d0 = 1.0;
  local_2c8 = (Expression *)0x0;
  pEStack_2c0 = (Expression *)0x0;
  local_2b8 = (OptInfo *)local_120;
  Pass::setPassRunner((Pass *)auStack_3f8,
                      (PassRunner *)optInfo.newOnceGlobalsSetInFuncs._M_h._M_single_bucket[1]._M_nxt
                     );
  (**(_func_int **)((long)auStack_3f8 + 0x10))((Pass *)auStack_3f8);
  anon_unknown_102::Scanner::~Scanner((Scanner *)auStack_3f8);
  while (psVar14 = (size_type *)*psVar14, psVar14 != (size_type *)0x0) {
    if (psVar14[4] != 0) {
      pmVar6 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_120,(key_type *)(psVar14 + 3));
      if (((pmVar6->_M_base)._M_i & 1U) == 0) {
        *(undefined8 *)(psVar14 + 3) = 0;
        psVar14[4] = 0;
      }
    }
  }
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = false;
  for (puVar12 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar2; puVar12 = puVar12 + 1
      ) {
    this_00 = (_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&optInfo.onceFuncs._M_h._M_single_bucket,
                              (key_type *)
                              (puVar12->_M_t).
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    pmVar7 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&optInfo.onceGlobals._M_h._M_single_bucket,
                          (key_type *)
                          (puVar12->_M_t).
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    auStack_3f8 = (undefined1  [8])(pmVar7->super_IString).str._M_len;
    global_1.super_IString.str._M_len = (size_t)(pmVar7->super_IString).str._M_str;
    if ((char *)global_1.super_IString.str._M_len != (char *)0x0) {
      bVar9 = true;
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert(this_00,(value_type *)auStack_3f8);
    }
  }
  if (bVar9) {
    uVar13 = 0;
    do {
      puVar2 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar12 = (module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar2;
          puVar12 = puVar12 + 1) {
        std::__detail::
        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)__ht,(key_type *)
                             (puVar12->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      }
      global_1.super_IString.str._M_len = 0;
      global_1.super_IString.str._M_str = (char *)&local_3d8;
      local_3d8._M_local_buf[0] = '\0';
      local_3c8 = (Expression **)0x0;
      sStack_3c0 = 0;
      local_288 = (pointer)0x0;
      local_298 = (pointer)0x0;
      ppEStack_290 = (pointer)0x0;
      local_2f8 = (Module *)0x0;
      ppEStack_2f0 = (Expression **)0x0;
      local_308 = (pointer)0x0;
      pFStack_300 = (Function *)0x0;
      local_318 = (pointer)0x0;
      pTStack_310 = (pointer)0x0;
      local_230._M_color = _S_red;
      local_230._M_parent = (_Base_ptr)0x0;
      local_250 = (pointer)0x0;
      ppBStack_248 = (pointer)0x0;
      local_260 = (pointer)0x0;
      ppBStack_258 = (pointer)0x0;
      local_270 = (pointer)0x0;
      puStack_268 = (pointer)0x0;
      local_230._M_left = &local_230;
      local_158._M_color = _S_red;
      local_158._M_parent = (_Base_ptr)0x0;
      local_230._M_right = local_230._M_left;
      memset(local_210,0,0xb0);
      local_158._M_left = &local_158;
      local_138 = 0;
      auStack_3f8 = (undefined1  [8])&PTR__WalkerPass_00e1fb48;
      local_130 = local_120;
      local_158._M_right = local_158._M_left;
      Pass::setPassRunner((Pass *)auStack_3f8,
                          (PassRunner *)
                          optInfo.newOnceGlobalsSetInFuncs._M_h._M_single_bucket[1]._M_nxt);
      (**(_func_int **)((long)auStack_3f8 + 0x10))
                ((WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                  *)auStack_3f8,module);
      WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
      ::~WalkerPass((WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                     *)auStack_3f8);
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::operator=((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&optInfo.onceFuncs._M_h._M_single_bucket,
                  (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)__ht);
      uVar5 = 0;
      psVar8 = &optInfo.onceGlobalsSetInFuncs._M_h._M_bucket_count;
      while (psVar8 = (size_type *)*psVar8, psVar8 != (size_type *)0x0) {
        uVar5 = uVar5 + *(int *)(psVar8 + 6);
      }
      if (uVar5 < uVar13) {
        __assert_fail("currOnceGlobalsSet >= lastOnceGlobalsSet",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OnceReduction.cpp"
                      ,0x1b5,"virtual void wasm::OnceReduction::run(Module *)");
      }
      bVar9 = uVar13 < uVar5;
      uVar13 = uVar5;
    } while (bVar9);
  }
  anon_unknown_102::OptInfo::~OptInfo((OptInfo *)local_120);
  return;
}

Assistant:

void run(Module* module) override {
    OptInfo optInfo;

    // Fill out the initial data.
    for (auto& global : module->globals) {
      // For a global to possibly be "once", it must be an integer, and to not
      // be imported (as a mutable import may be read and written to from the
      // outside). As we scan code we will turn this into false if we see
      // anything that proves the global is not "once".
      // TODO: This limitation could perhaps only be on mutable ones, but
      //       immutable globals will not be considered "once" anyhow as they do
      //       not fit the pattern of being written after the first call.
      // TODO: non-integer types?
      optInfo.onceGlobals[global->name] =
        global->type.isInteger() && !global->imported();
    }
    for (auto& func : module->functions) {
      // Fill in the map so that it can be operated on in parallel.
      optInfo.onceFuncs[func->name] = Name();
    }
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Global) {
        // An exported global cannot be "once" since the outside may read and
        // write to it in ways we are unaware.
        // TODO: See comment above on mutability.
        optInfo.onceGlobals[ex->value] = false;
      }
    }

    // Scan the module to find out which globals and functions are "once".
    Scanner(optInfo).run(getPassRunner(), module);

    // Combine the information. We found which globals appear to be "once", but
    // other information may have proven they are not so, in fact. Specifically,
    // for a function to be "once" we need its global to also be such.
    for (auto& [_, onceGlobal] : optInfo.onceFuncs) {
      if (onceGlobal.is() && !optInfo.onceGlobals[onceGlobal]) {
        onceGlobal = Name();
      }
    }

    // Optimize using what we found. Keep iterating while we find things to
    // optimize, which we estimate using a counter of the total number of once
    // globals set by functions: as that increases, it means we are propagating
    // useful information.
    // TODO: limit # of iterations?
    Index lastOnceGlobalsSet = 0;

    // First, initialize onceGlobalsSetInFuncs for the first iteration, by
    // ensuring each item is present, and adding the "once" global for "once"
    // funcs.
    bool foundOnce = false;
    for (auto& func : module->functions) {
      // Either way, at least fill the data structure for parallel operation.
      auto& set = optInfo.onceGlobalsSetInFuncs[func->name];

      auto global = optInfo.onceFuncs[func->name];
      if (global.is()) {
        set.insert(global);
        foundOnce = true;
      }
    }

    if (!foundOnce) {
      // Nothing to optimize.
      return;
    }

    while (1) {
      // Initialize all the items in the new data structure that will be
      // populated.
      for (auto& func : module->functions) {
        optInfo.newOnceGlobalsSetInFuncs[func->name];
      }

      Optimizer(optInfo).run(getPassRunner(), module);

      optInfo.onceGlobalsSetInFuncs =
        std::move(optInfo.newOnceGlobalsSetInFuncs);

      // Count how many once globals are set, and see if we have any more work
      // to do.
      Index currOnceGlobalsSet = 0;
      for (auto& [_, globals] : optInfo.onceGlobalsSetInFuncs) {
        currOnceGlobalsSet += globals.size();
      }
      assert(currOnceGlobalsSet >= lastOnceGlobalsSet);
      if (currOnceGlobalsSet > lastOnceGlobalsSet) {
        lastOnceGlobalsSet = currOnceGlobalsSet;
        continue;
      }
      return;
    }
  }